

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
::clear(hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
        *this)

{
  bool bVar1;
  uint uVar2;
  node *pnVar3;
  uint local_24;
  uint num_remaining;
  node *p_end;
  node *p;
  hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
  *this_local;
  
  bVar1 = vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
          ::empty(&this->m_values);
  if (!bVar1) {
    p_end = get_node(this,0);
    uVar2 = vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
            ::size(&this->m_values);
    pnVar3 = p_end + uVar2;
    local_24 = this->m_num_valid;
    for (; p_end != pnVar3; p_end = p_end + 1) {
      if ((p_end->super_value_type).field_0x1c != '\0') {
        destruct_value_type(&p_end->super_value_type);
        local_24 = local_24 - 1;
        if (local_24 == 0) break;
      }
    }
    vector<crnlib::hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>::raw_node>
    ::clear_no_destruction(&this->m_values);
    this->m_hash_shift = 0x20;
    this->m_num_valid = 0;
    this->m_grow_threshold = 0;
  }
  return;
}

Assistant:

inline void clear()
        {
            if (!m_values.empty())
            {
                if (CRNLIB_HAS_DESTRUCTOR(Key) || CRNLIB_HAS_DESTRUCTOR(Value))
                {
                    node* p = &get_node(0);
                    node* p_end = p + m_values.size();

                    uint num_remaining = m_num_valid;
                    while (p != p_end)
                    {
                        if (p->state)
                        {
                            destruct_value_type(p);
                            num_remaining--;
                            if (!num_remaining)
                            {
                                break;
                            }
                        }

                        p++;
                    }
                }

                m_values.clear_no_destruction();

                m_hash_shift = 32;
                m_num_valid = 0;
                m_grow_threshold = 0;
            }
        }